

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableWriterFields
          (SwiftGenerator *this,FieldDef *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *create_body,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *create_header)

{
  Value *type_00;
  IdlNamer *this_00;
  CodeWriter *this_01;
  int *piVar1;
  BaseType BVar2;
  int iVar3;
  StructDef *def;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_02;
  char *pcVar4;
  string *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string optional_enum;
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_label;
  string check_if_vector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> body;
  string nullable_type;
  string type;
  string field_var;
  string field_field;
  string builder_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  allocator<char> local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_318;
  string local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,", _ fbb: inout FlatBufferBuilder) { ",
             (allocator<char> *)&local_250);
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_250,this_00,field);
  local_318 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)create_header;
  (*(this_00->super_Namer)._vptr_Namer[7])(&local_270,this_00,field);
  type_00 = &field->value;
  GenType_abi_cxx11_(&local_290,this,&type_00->type,false);
  if ((field->presence == kOptional) && ((type_00->type).base_type - BASE_TYPE_UTYPE < 0xc)) {
    std::operator+(&local_2b0,&local_290,"?");
  }
  else {
    std::__cxx11::string::string((string *)&local_2b0,(string *)&local_290);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"FIELDVAR",(allocator<char> *)&local_380);
  (*(this_00->super_Namer)._vptr_Namer[7])(&local_2f0,this_00,field);
  this_01 = &this->code_;
  CodeWriter::SetValue(this_01,&local_310,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"VALUETYPE",(allocator<char> *)&local_2f0);
  CodeWriter::SetValue(this_01,&local_310,&local_2b0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"OFFSET",(allocator<char> *)&local_380);
  (*(this_00->super_Namer)._vptr_Namer[0x12])(&local_2f0,this_00,field);
  CodeWriter::SetValue(this_01,&local_310,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"CONSTANT",(allocator<char> *)&local_380);
  SwiftConstant_abi_cxx11_(&local_2f0,this,field);
  CodeWriter::SetValue(this_01,&local_310,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  BVar2 = (type_00->type).base_type;
  pcVar4 = "VectorOf(";
  if (((BVar2 != BASE_TYPE_VECTOR) && (BVar2 != BASE_TYPE_VECTOR64)) &&
     (pcVar4 = "(", BVar2 == BASE_TYPE_ARRAY)) {
    pcVar4 = "VectorOf(";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,pcVar4,(allocator<char> *)&local_2f0);
  std::operator+(&local_3c0,"add",&local_310);
  std::operator+(&local_380,&local_3c0,&local_250);
  std::operator+(&local_2f0,&local_380,": ");
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::operator+(&local_380,"{{ACCESS_TYPE}} static func ",&local_2f0);
  std::operator+(&local_50,&local_380,"\\");
  CodeWriter::operator+=(this_01,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_380);
  std::operator+(&local_3a0,"{{STRUCTNAME}}.",&local_2f0);
  std::operator+(&local_3c0,&local_3a0,&local_250);
  std::operator+(&local_380,&local_3c0,", &fbb)");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)create_body,
             &local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  BVar2 = (type_00->type).base_type;
  if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
    if (BVar2 == BASE_TYPE_BOOL) {
      SwiftConstant_abi_cxx11_(&local_380,this,field);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"CONSTANT",(allocator<char> *)&local_3a0);
      CodeWriter::SetValue(this_01,&local_3c0,&local_380);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"VALUETYPE",(allocator<char> *)&local_358);
      pcVar4 = "Bool";
      if (field->presence == kOptional) {
        pcVar4 = "Bool?";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,pcVar4,(allocator<char> *)&local_338);
      CodeWriter::SetValue(this_01,&local_3c0,&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::operator+(&local_3c0,"{{VALUETYPE}}",&local_230);
      std::operator+(&local_d0,&local_3c0,"fbb.add(element: {{FIELDVAR}},\\");
      CodeWriter::operator+=(this_01,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_3c0);
      pcVar4 = " def: {{CONSTANT}},";
      if (field->presence == kOptional) {
        pcVar4 = "\\";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,pcVar4,(allocator<char> *)&local_3c0);
      CodeWriter::operator+=(this_01,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110," at: {{TABLEOFFSET}}.{{OFFSET}}.p) }",
                 (allocator<char> *)&local_3c0);
      CodeWriter::operator+=(this_01,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::operator+(&local_338,&local_270,": ");
      std::operator+(&local_358,&local_338,&local_2b0);
      std::operator+(&local_3a0,&local_358," = ");
      if (field->presence == kOptional) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"nil",(allocator<char> *)&local_1f0);
      }
      else {
        std::__cxx11::string::string((string *)&local_2d0,(string *)&local_380);
      }
      std::operator+(&local_3c0,&local_3a0,&local_2d0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_318,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_358);
      pbVar5 = &local_338;
    }
    else {
      pcVar4 = ".rawValue";
      if ((field->value).type.enum_def == (EnumDef *)0x0) {
        pcVar4 = "";
      }
      if (9 < BVar2 - BASE_TYPE_UTYPE) {
        pcVar4 = "";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,pcVar4,(allocator<char> *)&local_3c0);
      if (((field->value).type.enum_def == (EnumDef *)0x0) ||
         (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c0,"",(allocator<char> *)&local_3a0);
      }
      else {
        std::operator+(&local_3c0,"?",&local_380);
      }
      std::operator+(&local_3a0,"{{VALUETYPE}}",&local_230);
      std::operator+(&local_70,&local_3a0,"fbb.add(element: {{FIELDVAR}}\\");
      CodeWriter::operator+=(this_01,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_3a0);
      if (field->presence == kOptional) {
        std::operator+(&local_1d0,&local_3c0,"\\");
      }
      else {
        std::operator+(&local_1d0,&local_380,", def: {{CONSTANT}}\\");
      }
      CodeWriter::operator+=(this_01,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,", at: {{TABLEOFFSET}}.{{OFFSET}}.p) }",
                 (allocator<char> *)&local_3a0);
      CodeWriter::operator+=(this_01,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (((field->value).type.enum_def == (EnumDef *)0x0) ||
         (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
        SwiftConstant_abi_cxx11_(&local_3a0,this,field);
      }
      else if (field->presence == kOptional) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a0,"nil",(allocator<char> *)&local_358);
      }
      else {
        GenEnumDefaultValue_abi_cxx11_(&local_3a0,this,field);
      }
      std::operator+(&local_b0,"",&local_250);
      std::operator+(&local_1f0,&local_b0,": ");
      std::operator+(&local_2d0,&local_1f0,&local_2b0);
      std::operator+(&local_338,&local_2d0," = ");
      if (field->presence == kOptional) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"nil",&local_359);
      }
      else {
        std::__cxx11::string::string((string *)&local_210,(string *)&local_3a0);
      }
      std::operator+(&local_358,&local_338,&local_210);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_318,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_b0);
      this_03 = &local_3a0;
LAB_0021e72c:
      std::__cxx11::string::~string((string *)this_03);
      pbVar5 = &local_3c0;
    }
    std::__cxx11::string::~string((string *)pbVar5);
  }
  else {
    if ((BVar2 == BASE_TYPE_STRUCT) && (((field->value).type.struct_def)->fixed == true)) {
      std::operator+(&local_3c0,&local_290,"?");
      std::operator+(&local_380,&local_3c0,&local_230);
      this_02 = local_318;
      std::operator+(&local_130,&local_380,
                     "guard let {{FIELDVAR}} = {{FIELDVAR}} else { return }; fbb.create(struct: {{FIELDVAR}}, position: {{TABLEOFFSET}}.{{OFFSET}}.p) }"
                    );
      CodeWriter::operator+=(this_01,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::operator+(&local_3a0,&local_270,": ");
      std::operator+(&local_3c0,&local_3a0,&local_290);
      pcVar4 = "";
      if (field->presence == kOptional) {
        pcVar4 = "? = nil";
      }
      std::operator+(&local_380,&local_3c0,pcVar4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(this_02,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3c0);
      pbVar5 = &local_3a0;
      goto LAB_0021e740;
    }
    (*(this_00->super_Namer)._vptr_Namer[7])(&local_3c0,this_00,field);
    BVar2 = (type_00->type).base_type;
    pcVar4 = "VectorOffset";
    if (((BVar2 != BASE_TYPE_VECTOR) && (BVar2 != BASE_TYPE_VECTOR64)) &&
       (pcVar4 = "Offset", BVar2 == BASE_TYPE_ARRAY)) {
      pcVar4 = "VectorOffset";
    }
    std::operator+(&local_380,&local_3c0,pcVar4);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::operator+(&local_2d0,&local_380," ");
    std::operator+(&local_338,&local_2d0,&local_270);
    std::operator+(&local_358,&local_338,": ");
    std::operator+(&local_3a0,&local_358,"Offset");
    pcVar4 = " = Offset()";
    if (field->presence == kRequired) {
      pcVar4 = "";
    }
    std::operator+(&local_3c0,&local_3a0,pcVar4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_318,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2d0);
    if ((type_00->type).base_type == BASE_TYPE_STRUCT) {
      pcVar4 = "offset: {{FIELDVAR}}, at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
      if (((field->value).type.struct_def)->fixed != false) {
        pcVar4 = "structOffset: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
      }
    }
    else {
      pcVar4 = "offset: {{FIELDVAR}}, at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
    }
    std::operator+(&local_3a0,"Offset",&local_230);
    std::operator+(&local_3c0,&local_3a0,"fbb.add(");
    std::operator+(&local_150,&local_3c0,pcVar4);
    CodeWriter::operator+=(this_01,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
    if (((((field->value).type.element == BASE_TYPE_STRUCT) &&
         (def = (field->value).type.struct_def, def->fixed == true)) &&
        (BVar2 = (type_00->type).base_type, BVar2 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE))) &&
       ((0x64000U >> (BVar2 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
      IdlNamer::NamespacedType_abi_cxx11_(&local_3c0,this_00,&def->super_Definition);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,"start_vector_of",(allocator<char> *)&local_2d0);
      Namer::Method(&local_358,&this_00->super_Namer,&local_338,&local_270);
      std::operator+(&local_3a0,"{{ACCESS_TYPE}} static func ",&local_358);
      std::operator+(&local_170,&local_3a0,"(_ size: Int, in builder: inout FlatBufferBuilder) {");
      CodeWriter::operator+=(this_01,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_338);
      piVar1 = &(this->code_).cur_ident_lvl_;
      *piVar1 = *piVar1 + 1;
      std::operator+(&local_338,"builder.startVector(size * MemoryLayout<",&local_3c0);
      std::operator+(&local_358,&local_338,">.size, elementSize: MemoryLayout<");
      std::operator+(&local_3a0,&local_358,&local_3c0);
      std::operator+(&local_190,&local_3a0,">.alignment)");
      CodeWriter::operator+=(this_01,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_338);
      iVar3 = (this->code_).cur_ident_lvl_;
      if (iVar3 != 0) {
        (this->code_).cur_ident_lvl_ = iVar3 + -1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"}",(allocator<char> *)&local_3a0);
      CodeWriter::operator+=(this_01,&local_1b0);
      this_03 = &local_1b0;
      goto LAB_0021e72c;
    }
  }
  pbVar5 = &local_380;
LAB_0021e740:
  std::__cxx11::string::~string((string *)pbVar5);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  return;
}

Assistant:

void GenTableWriterFields(const FieldDef &field,
                            std::vector<std::string> *create_body,
                            std::vector<std::string> *create_header) {
    std::string builder_string = ", _ fbb: inout FlatBufferBuilder) { ";
    auto &create_func_body = *create_body;
    auto &create_func_header = *create_header;
    const auto field_field = namer_.Field(field);
    const auto field_var = namer_.Variable(field);
    const auto type = GenType(field.value.type);
    const auto opt_scalar =
        field.IsOptional() && IsScalar(field.value.type.base_type);
    const auto nullable_type = opt_scalar ? type + "?" : type;
    code_.SetValue("FIELDVAR", namer_.Variable(field));
    code_.SetValue("VALUETYPE", nullable_type);
    code_.SetValue("OFFSET", namer_.Field(field));
    code_.SetValue("CONSTANT", SwiftConstant(field));
    std::string check_if_vector =
        (IsVector(field.value.type) || IsArray(field.value.type)) ? "VectorOf("
                                                                  : "(";
    const auto body = "add" + check_if_vector + field_field + ": ";
    code_ += "{{ACCESS_TYPE}} static func " + body + "\\";

    create_func_body.push_back("{{STRUCTNAME}}." + body + field_field +
                               ", &fbb)");

    if (IsScalar(field.value.type.base_type) &&
        !IsBool(field.value.type.base_type)) {
      const std::string is_enum = IsEnum(field.value.type) ? ".rawValue" : "";
      const std::string optional_enum =
          IsEnum(field.value.type) ? ("?" + is_enum) : "";
      code_ +=
          "{{VALUETYPE}}" + builder_string + "fbb.add(element: {{FIELDVAR}}\\";

      code_ += field.IsOptional() ? (optional_enum + "\\")
                                  : (is_enum + ", def: {{CONSTANT}}\\");

      code_ += ", at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";

      const auto default_value =
          IsEnum(field.value.type)
              ? (field.IsOptional() ? "nil" : GenEnumDefaultValue(field))
              : SwiftConstant(field);
      create_func_header.push_back(
          "" + field_field + ": " + nullable_type + " = " +
          (field.IsOptional() ? "nil" : default_value));
      return;
    }

    if (IsBool(field.value.type.base_type)) {
      std::string default_value = SwiftConstant(field);

      code_.SetValue("CONSTANT", default_value);
      code_.SetValue("VALUETYPE", field.IsOptional() ? "Bool?" : "Bool");
      code_ +=
          "{{VALUETYPE}}" + builder_string + "fbb.add(element: {{FIELDVAR}},\\";
      code_ += field.IsOptional() ? "\\" : " def: {{CONSTANT}},";
      code_ += " at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
      create_func_header.push_back(
          field_var + ": " + nullable_type + " = " +
          (field.IsOptional() ? "nil" : default_value));
      return;
    }

    if (IsStruct(field.value.type)) {
      const auto create_struct =
          "guard let {{FIELDVAR}} = {{FIELDVAR}} else { return };"
          " fbb.create(struct: {{FIELDVAR}}, position: "
          "{{TABLEOFFSET}}.{{OFFSET}}.p) }";
      code_ += type + "?" + builder_string + create_struct;
      /// Optional hard coded since structs are always optional
      create_func_header.push_back(field_var + ": " + type +
                                   (field.IsOptional() ? "? = nil" : ""));
      return;
    }

    const auto arg_label =
        namer_.Variable(field) +
        (IsVector(field.value.type) || IsArray(field.value.type)
             ? "VectorOffset"
             : "Offset");
    create_func_header.push_back(arg_label + " " + field_var + ": " + "Offset" +
                                 (field.IsRequired() ? "" : " = Offset()"));
    const auto reader_type =
        IsStruct(field.value.type) && field.value.type.struct_def->fixed
            ? "structOffset: {{TABLEOFFSET}}.{{OFFSET}}.p) }"
            : "offset: {{FIELDVAR}}, at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
    code_ += "Offset" + builder_string + "fbb.add(" + reader_type;

    const auto vectortype = field.value.type.VectorType();

    if ((vectortype.base_type == BASE_TYPE_STRUCT &&
         field.value.type.struct_def->fixed) &&
        (IsVector(field.value.type) || IsArray(field.value.type))) {
      const auto field_name = namer_.NamespacedType(*vectortype.struct_def);
      code_ += "{{ACCESS_TYPE}} static func " +
               namer_.Method("start_vector_of", field_var) +
               "(_ size: Int, in builder: inout "
               "FlatBufferBuilder) {";
      Indent();
      code_ += "builder.startVector(size * MemoryLayout<" + field_name +
               ">.size, elementSize: MemoryLayout<" + field_name +
               ">.alignment)";
      Outdent();
      code_ += "}";
    }
  }